

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDriver.c
# Opt level: O3

int HaveGarbageAtTheEnd(FILE *out)

{
  int iVar1;
  void *pvVar2;
  char c;
  char local_29;
  
  iVar1 = __isoc99_fscanf(out,"%c",&local_29);
  if (-1 < iVar1) {
    do {
      pvVar2 = memchr(" \t\r\n",(int)local_29,5);
      if (pvVar2 == (void *)0x0) {
        PrintWithoutBuffering("garbage at the end -- ");
        return 1;
      }
      iVar1 = __isoc99_fscanf(out,"%c",&local_29);
    } while (-1 < iVar1);
  }
  return 0;
}

Assistant:

int HaveGarbageAtTheEnd(FILE* out) {
    while (1) {
        char c;
        int status = fscanf(out, "%c", &c);
        if (status < 0) {
            return 0;
        }
        if (!strchr(" \t\r\n", c)) {
            PrintWithoutBuffering("garbage at the end -- ");
            return 1;
        }
    }
}